

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setValue(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *x)

{
  bool bVar1;
  type_conflict5 tVar2;
  int n;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  int i_local;
  cpp_dec_float<50U,_int,_void> local_d0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_70;
  undefined1 local_6c;
  undefined8 local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_60;
  
  i_local = i;
  if (this->setupStatus == true) {
    n = IdxSet::pos(&this->super_IdxSet,i);
    if (n < 0) {
      local_98 = *(undefined8 *)(x->m_backend).data._M_elems;
      uStack_90 = *(undefined8 *)((x->m_backend).data._M_elems + 2);
      local_88 = *(undefined8 *)((x->m_backend).data._M_elems + 4);
      uStack_80 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
      local_78 = *(undefined8 *)((x->m_backend).data._M_elems + 8);
      local_70 = (x->m_backend).exp;
      local_6c = (x->m_backend).neg;
      local_68._0_4_ = (x->m_backend).fpclass;
      local_68._4_4_ = (x->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)&local_d0,(multiprecision *)&local_98,arg);
      getEpsilon(&local_60,this);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d0,&local_60);
      if (tVar2) {
        IdxSet::add(&this->super_IdxSet,1,&i_local);
        i = i_local;
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_d0,0,(type *)0x0);
      bVar1 = boost::multiprecision::operator==
                        (x,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_d0);
      if (bVar1) {
        clearNum(this,n);
      }
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&x->m_backend);
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }